

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O3

void prf_state_reset(prf_state_t *state)

{
  matrix4x4_f32_t *paafVar1;
  
  state->object_transparency = 0;
  state->object_flags = 0;
  state->model = (prf_model_t *)0x0;
  state->node = (prf_node_t *)0x0;
  state->header = (prf_node_t *)0x0;
  state->vertex_palette = (prf_node_t *)0x0;
  state->color_palette = (prf_node_t *)0x0;
  state->material_palette = (prf_node_t *)0x0;
  prf_array_set_count(state->materials,0);
  prf_array_set_count(state->textures,0);
  prf_array_set_count(state->instances,0);
  paafVar1 = *state->matrix;
  (*paafVar1)[0][0] = 1.0;
  ((float32_t *)((long)paafVar1 + 0))[1] = 0.0;
  ((float32_t *)((long)paafVar1 + 0))[2] = 0.0;
  *(undefined8 *)((*paafVar1)[0] + 3) = 0;
  (*paafVar1)[1][1] = 1.0;
  *(float32_t *)((long)(*paafVar1 + 1) + 8) = 0.0;
  *(float32_t *)((long)(*paafVar1 + 1) + 0xc) = 0.0;
  ((float32_t *)((long)paafVar1 + 0x20))[0] = 0.0;
  ((float32_t *)((long)paafVar1 + 0x20))[1] = 0.0;
  (*paafVar1)[2][2] = 1.0;
  *(undefined8 *)((*paafVar1)[2] + 3) = 0;
  *(float32_t *)((long)(*paafVar1 + 3) + 4) = 0.0;
  *(float32_t *)((long)(*paafVar1 + 3) + 8) = 0.0;
  (*paafVar1)[3][3] = 1.0;
  state->inv_dirty = 1;
  state->state_push_level = 0;
  state->physical_level = 0;
  state->push_level = 0;
  state->subface_level = 0;
  state->attribute_level = 0;
  state->extension_level = 0;
  return;
}

Assistant:

void
prf_state_reset(
    prf_state_t * state )
{
    matrix4x4_f32_t * m;
    state->model = NULL;
    state->node = NULL;

    state->header = 0;
    state->vertex_palette = NULL;
    state->color_palette = NULL;
    state->material_palette = NULL;
    state->object_transparency = 0;
    state->object_flags = 0;
    prf_array_set_count( state->materials, 0 );
    prf_array_set_count( state->textures, 0 );
    prf_array_set_count( state->instances, 0 );
    m = state->matrix[0];
    (*m)[0][0]=1.0f; (*m)[0][1]=0.0f; (*m)[0][2]=0.0f; (*m)[0][3]=0.0f;
    (*m)[1][0]=0.0f; (*m)[1][1]=1.0f; (*m)[1][2]=0.0f; (*m)[1][3]=0.0f;
    (*m)[2][0]=0.0f; (*m)[2][1]=0.0f; (*m)[2][2]=1.0f; (*m)[2][3]=0.0f;
    (*m)[3][0]=0.0f; (*m)[3][1]=0.0f; (*m)[3][2]=0.0f; (*m)[3][3]=1.0f;
    state->inv_dirty = TRUE;

    state->push_level = 0;
    state->subface_level = 0;
    state->attribute_level = 0;
    state->extension_level = 0;

    state->state_push_level = 0;
    state->physical_level = 0;
}